

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O1

int check_revocation(X509_STORE_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  X509 *a;
  X509_NAME *nm;
  OPENSSL_STACK *sk;
  X509 *x;
  EVP_PKEY *r;
  uint *puVar5;
  ulong uVar6;
  X509_CRL *a_00;
  bool bVar7;
  int crl_score;
  X509 *issuer;
  uint local_58;
  uint local_54;
  X509_CRL *local_50;
  X509 *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar6 = ctx->param->flags;
  local_54 = 1;
  if ((uVar6 & 4) != 0) {
    uVar1 = 0;
    if ((uVar6 & 8) != 0) {
      sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->chain);
      uVar1 = (int)sVar4 - 1;
    }
    local_54 = uVar1 >> 0x1f;
    if (-1 < (int)uVar1) {
      local_40 = (ulong)uVar1;
      local_38 = (ulong)(uVar1 + 1);
      uVar6 = 0;
      do {
        ctx->error_depth = (int)uVar6;
        a = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ctx->chain,uVar6);
        ctx->current_cert = (X509 *)a;
        ctx->current_crl_issuer = (X509 *)0x0;
        ctx->current_crl_score = 0;
        local_48 = (X509 *)0x0;
        local_58 = 0;
        local_50 = (X509_CRL *)0x0;
        puVar5 = &local_58;
        iVar2 = get_crl_sk(ctx,(X509_CRL **)&local_50,&local_48,(int *)&local_58,ctx->crls);
        if (iVar2 == 0) {
          nm = (X509_NAME *)X509_get_issuer_name(a);
          sk = (OPENSSL_STACK *)X509_STORE_CTX_get1_crls(ctx,nm);
          if ((sk != (OPENSSL_STACK *)0x0) || (local_50 == (X509_CRL *)0x0)) {
            puVar5 = &local_58;
            get_crl_sk(ctx,(X509_CRL **)&local_50,&local_48,(int *)&local_58,(stack_st_X509_CRL *)sk
                      );
            OPENSSL_sk_pop_free_ex(sk,sk_X509_CRL_call_free_func,X509_CRL_free);
          }
        }
        a_00 = local_50;
        if (local_50 == (X509_CRL *)0x0) {
          a_00 = (X509_CRL *)0x0;
          ctx->error = 3;
          uVar1 = (*ctx->verify_cb)(0,ctx);
          if (1 < uVar1) goto LAB_002ab3fe;
        }
        else {
          ctx->current_crl_issuer = local_48;
          puVar5 = (uint *)(ulong)local_58;
          ctx->current_crl_score = local_58;
          ctx->current_crl = (X509_CRL *)local_50;
          iVar2 = ctx->error_depth;
          sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->chain);
          x = ctx->current_crl_issuer;
          if (x == (X509 *)0x0) {
            iVar3 = (int)sVar4 + -1;
            if (iVar2 < iVar3) {
              x = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ctx->chain,(long)iVar2 + 1);
              goto LAB_002ab26b;
            }
            x = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ctx->chain,(long)iVar3);
            iVar2 = x509_check_issued_with_callback(ctx,x,x);
            if (iVar2 != 0) goto LAB_002ab26b;
            ctx->error = 0x21;
            uVar1 = (*ctx->verify_cb)(0,ctx);
            if (1 < uVar1) goto LAB_002ab3fe;
            if (uVar1 != 0) goto LAB_002ab26b;
          }
          else {
LAB_002ab26b:
            if (x == (X509 *)0x0) {
LAB_002ab350:
              if (((ctx->param->flags & 0x10) == 0) && ((a_00->flags & 0x200) != 0)) {
                ctx->error = 0x24;
                uVar1 = (*ctx->verify_cb)(0,ctx);
                if (1 < uVar1) goto LAB_002ab3fe;
                if (uVar1 == 0) goto LAB_002ab3b1;
              }
              iVar2 = X509_CRL_get0_by_cert(a_00,(X509_REVOKED **)&local_48,a);
              if (iVar2 != 0) {
                ctx->error = 0x17;
                uVar1 = (*ctx->verify_cb)(0,ctx);
                if (1 < uVar1) {
LAB_002ab3fe:
                  abort();
                }
                if (uVar1 == 0) goto LAB_002ab3b1;
              }
              uVar1 = 1;
              goto LAB_002ab3b4;
            }
            if (((x->ex_flags & 2) != 0) && ((x->ex_kusage & 2) == 0)) {
              ctx->error = 0x23;
              uVar1 = (*ctx->verify_cb)(0,ctx);
              if (1 < uVar1) goto LAB_002ab3fe;
              if (uVar1 == 0) goto LAB_002ab3b1;
            }
            if ((ctx->current_crl_score & 0x80) == 0) {
              ctx->error = 0x2c;
              uVar1 = (*ctx->verify_cb)(0,ctx);
              if (1 < uVar1) goto LAB_002ab3fe;
              if (uVar1 == 0) goto LAB_002ab3b1;
            }
            if ((a_00->idp_flags & 2) != 0) {
              ctx->error = 0x29;
              uVar1 = (*ctx->verify_cb)(0,ctx);
              if (1 < uVar1) goto LAB_002ab3fe;
              if (uVar1 == 0) goto LAB_002ab3b1;
            }
            if (((ctx->current_crl_score & 0x40) != 0) ||
               (iVar2 = check_crl_time(ctx,(X509_CRL *)a_00,1), iVar2 != 0)) {
              r = (EVP_PKEY *)X509_get0_pubkey(x);
              if (r == (EVP_PKEY *)0x0) {
                ctx->error = 6;
              }
              else {
                iVar2 = X509_CRL_verify(a_00,r);
                if (0 < iVar2) goto LAB_002ab350;
                ctx->error = 8;
              }
              uVar1 = (*ctx->verify_cb)(0,ctx);
              if (1 < uVar1) goto LAB_002ab3fe;
              if (uVar1 != 0) goto LAB_002ab350;
            }
          }
LAB_002ab3b1:
          uVar1 = 0;
        }
LAB_002ab3b4:
        X509_CRL_free(a_00);
        ctx->current_crl = (X509_CRL *)0x0;
        if (uVar1 == 0) break;
        bVar7 = local_40 <= uVar6;
        uVar6 = uVar6 + 1;
        local_54 = (uint)CONCAT71((int7)((ulong)puVar5 >> 8),bVar7);
      } while (local_38 != uVar6);
    }
    local_54 = local_54 & 1;
  }
  return local_54;
}

Assistant:

static int check_revocation(X509_STORE_CTX *ctx) {
  if (!(ctx->param->flags & X509_V_FLAG_CRL_CHECK)) {
    return 1;
  }
  int last;
  if (ctx->param->flags & X509_V_FLAG_CRL_CHECK_ALL) {
    last = (int)sk_X509_num(ctx->chain) - 1;
  } else {
    last = 0;
  }
  for (int i = 0; i <= last; i++) {
    ctx->error_depth = i;
    if (!check_cert(ctx)) {
      return 0;
    }
  }
  return 1;
}